

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeReservoirs(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppNVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  _func_int **pp_Var6;
  int iVar7;
  ostream *poVar8;
  Reservoir *resv;
  pointer ppNVar9;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[RESERVOIRS]\n");
  ppNVar2 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar2; ppNVar9 = ppNVar9 + 1) {
    pNVar3 = *ppNVar9;
    iVar7 = (*(pNVar3->super_Element)._vptr_Element[2])(pNVar3);
    if (iVar7 == 2) {
      lVar4 = *(long *)&this->field_0x18;
      lVar5 = *(long *)(lVar4 + -0x18);
      *(uint *)(&this->field_0x30 + lVar5) =
           *(uint *)(&this->field_0x30 + lVar5) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0x10;
      poVar8 = std::operator<<((ostream *)puVar1,(string *)&(pNVar3->super_Element).name);
      std::operator<<(poVar8," ");
      lVar4 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar4 + -0x18)) = 4;
      std::ostream::_M_insert<double>(pNVar3->elev * (this->network->units).factors[1]);
      pp_Var6 = pNVar3[1].super_Element._vptr_Element;
      if (pp_Var6 != (_func_int **)0x0) {
        std::operator<<((ostream *)puVar1,(string *)(pp_Var6 + 1));
      }
      std::operator<<((ostream *)puVar1,"\n");
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeReservoirs()
{
    fout << "\n[RESERVOIRS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::RESERVOIR )
        {
            Reservoir* resv = static_cast<Reservoir*>(node);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->elev*network->ucf(Units::LENGTH);
            if ( resv->headPattern )
            {
                fout << resv->headPattern->name;
            }
            fout << "\n";
        }
    }
}